

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalGenerator::Generate(cmGlobalGenerator *this)

{
  bool bVar1;
  pointer this_00;
  cmake *pcVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  pointer pcVar6;
  cmMakefile *pcVar7;
  pointer pcVar8;
  ostream *poVar9;
  rep_conflict rVar10;
  PolicyID id;
  PolicyID id_00;
  LocalGeneratorVector *this_01;
  float local_77c;
  string local_710;
  int local_6ec;
  ostringstream local_6e8 [8];
  ostringstream msg;
  duration<long,_std::ratio<1L,_1000000000L>_> local_570;
  duration<long,_std::ratio<1L,_1000L>_> local_568;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> ms;
  time_point endTime;
  string local_540;
  reference local_520;
  string *t_1;
  iterator __end2_1;
  iterator __begin2_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_1;
  undefined1 local_4e0 [8];
  ostringstream w_1;
  cmListFileBacktrace local_368;
  string local_350;
  reference local_330;
  string *t;
  iterator __end2;
  iterator __begin2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  undefined1 local_2f0 [8];
  ostringstream w;
  cmListFileBacktrace local_178;
  allocator<char> local_159;
  string local_158;
  reference local_138;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>
  *buildExpSet;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>_>
  *__range1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_110;
  allocator<char> local_101;
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  uint local_8c;
  undefined1 auStack_88 [4];
  uint i;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_80;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_18;
  time_point startTime;
  cmGlobalGenerator *this_local;
  
  startTime.__d.__r = (duration)(duration)this;
  local_18.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  (*this->_vptr_cmGlobalGenerator[0x41])();
  ProcessEvaluationFiles(this);
  pcVar2 = this->CMakeInstance;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Generating",&local_39);
  cmake::UpdateProgress(pcVar2,&local_38,0.1);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  this_00 = std::
            unique_ptr<cmQtAutoGenGlobalInitializer,_std::default_delete<cmQtAutoGenGlobalInitializer>_>
            ::operator->(&this->QtAutoGen);
  bVar1 = cmQtAutoGenGlobalInitializer::SetupCustomTargets(this_00);
  if (bVar1) {
    for (local_8c = 0; uVar3 = (ulong)local_8c,
        sVar4 = std::
                vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                ::size(&this->LocalGenerators), uVar3 < sVar4; local_8c = local_8c + 1) {
      this_01 = &this->LocalGenerators;
      pvVar5 = std::
               vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
               ::operator[](this_01,(ulong)local_8c);
      pcVar6 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                         (pvVar5);
      pcVar7 = cmLocalGenerator::GetMakefile(pcVar6);
      SetCurrentMakefile(this,pcVar7);
      pvVar5 = std::
               vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
               ::operator[](this_01,(ulong)local_8c);
      pcVar6 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                         (pvVar5);
      (*(pcVar6->super_cmOutputConverter)._vptr_cmOutputConverter[3])();
      pvVar5 = std::
               vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
               ::operator[](this_01,(ulong)local_8c);
      pcVar6 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                         (pvVar5);
      pcVar7 = cmLocalGenerator::GetMakefile(pcVar6);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"CMAKE_SKIP_INSTALL_RULES",&local_b1);
      bVar1 = cmMakefile::IsOn(pcVar7,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator(&local_b1);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        pvVar5 = std::
                 vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                 ::operator[](&this->LocalGenerators,(ulong)local_8c);
        pcVar6 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::
                 operator->(pvVar5);
        cmLocalGenerator::GenerateInstallRules(pcVar6);
      }
      pvVar5 = std::
               vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
               ::operator[](&this->LocalGenerators,(ulong)local_8c);
      pcVar6 = std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>::operator->
                         (pvVar5);
      cmLocalGenerator::GenerateTestFiles(pcVar6);
      pcVar2 = this->CMakeInstance;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"Generating",&local_d9)
      ;
      uVar3 = (ulong)local_8c;
      sVar4 = std::
              vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
              ::size(&this->LocalGenerators);
      local_77c = (float)sVar4;
      cmake::UpdateProgress(pcVar2,&local_d8,(((float)uVar3 + 1.0) * 0.9) / local_77c + 0.1);
      std::__cxx11::string::~string((string *)&local_d8);
      std::allocator<char>::~allocator(&local_d9);
    }
    SetCurrentMakefile(this,(cmMakefile *)0x0);
    bVar1 = GenerateCPackPropertiesFile(this);
    if (!bVar1) {
      pcVar2 = GetCMakeInstance(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_100,"Could not write CPack properties file.",&local_101);
      __range1 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>_>
                  *)0x0;
      _Stack_110._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&__range1);
      cmake::IssueMessage(pcVar2,FATAL_ERROR,&local_100,(cmListFileBacktrace *)&__range1);
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&__range1);
      std::__cxx11::string::~string((string *)&local_100);
      std::allocator<char>::~allocator(&local_101);
    }
    __end1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>_>
             ::begin(&this->BuildExportSets);
    buildExpSet = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>
                   *)std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>_>
                     ::end(&this->BuildExportSets);
    while (bVar1 = std::operator!=(&__end1,(_Self *)&buildExpSet), bVar1) {
      local_138 = std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>
                  ::operator*(&__end1);
      bVar1 = cmExportFileGenerator::GenerateImportFile
                        (&local_138->second->super_cmExportFileGenerator);
      if (!bVar1) {
        bVar1 = cmSystemTools::GetErrorOccurredFlag();
        if (bVar1) {
          return;
        }
        pcVar2 = GetCMakeInstance(this);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_158,"Could not write export file.",&local_159);
        local_178.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        local_178.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
        super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        cmListFileBacktrace::cmListFileBacktrace(&local_178);
        cmake::IssueMessage(pcVar2,FATAL_ERROR,&local_158,&local_178);
        cmListFileBacktrace::~cmListFileBacktrace(&local_178);
        std::__cxx11::string::~string((string *)&local_158);
        std::allocator<char>::~allocator(&local_159);
        return;
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportBuildFileGenerator_*>_>
      ::operator++(&__end1);
    }
    CheckRuleHashes(this);
    WriteSummary(this);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->ExtraGenerator);
    if (bVar1) {
      pcVar8 = std::
               unique_ptr<cmExternalMakefileProjectGenerator,_std::default_delete<cmExternalMakefileProjectGenerator>_>
               ::operator->(&this->ExtraGenerator);
      (*pcVar8->_vptr_cmExternalMakefileProjectGenerator[4])();
    }
    CheckTargetLinkLibraries(this);
    bVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&this->CMP0042WarnTargets);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2f0);
      cmPolicies::GetPolicyWarning_abi_cxx11_((string *)&__range2,(cmPolicies *)0x2a,id);
      poVar9 = std::operator<<((ostream *)local_2f0,(string *)&__range2);
      std::operator<<(poVar9,"\n");
      std::__cxx11::string::~string((string *)&__range2);
      std::operator<<((ostream *)local_2f0,
                      "MACOSX_RPATH is not specified for the following targets:\n");
      __end2 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&this->CMP0042WarnTargets);
      t = (string *)
          std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end(&this->CMP0042WarnTargets);
      while (bVar1 = std::operator!=(&__end2,(_Self *)&t), bVar1) {
        local_330 = std::
                    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator*(&__end2);
        poVar9 = std::operator<<((ostream *)local_2f0," ");
        poVar9 = std::operator<<(poVar9,(string *)local_330);
        std::operator<<(poVar9,"\n");
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end2);
      }
      pcVar2 = GetCMakeInstance(this);
      std::__cxx11::ostringstream::str();
      local_368.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_368.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      cmListFileBacktrace::cmListFileBacktrace(&local_368);
      cmake::IssueMessage(pcVar2,AUTHOR_WARNING,&local_350,&local_368);
      cmListFileBacktrace::~cmListFileBacktrace(&local_368);
      std::__cxx11::string::~string((string *)&local_350);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2f0);
    }
    bVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&this->CMP0068WarnTargets);
    if (!bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4e0);
      cmPolicies::GetPolicyWarning_abi_cxx11_((string *)&__range2_1,(cmPolicies *)0x44,id_00);
      poVar9 = std::operator<<((ostream *)local_4e0,(string *)&__range2_1);
      std::operator<<(poVar9,
                      "\nFor compatibility with older versions of CMake, the install_name fields for the following targets are still affected by RPATH settings:\n"
                     );
      std::__cxx11::string::~string((string *)&__range2_1);
      __end2_1 = std::
                 set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin(&this->CMP0068WarnTargets);
      t_1 = (string *)
            std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::end(&this->CMP0068WarnTargets);
      while (bVar1 = std::operator!=(&__end2_1,(_Self *)&t_1), bVar1) {
        local_520 = std::
                    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ::operator*(&__end2_1);
        poVar9 = std::operator<<((ostream *)local_4e0," ");
        poVar9 = std::operator<<(poVar9,(string *)local_520);
        std::operator<<(poVar9,"\n");
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end2_1);
      }
      pcVar2 = GetCMakeInstance(this);
      std::__cxx11::ostringstream::str();
      endTime.__d.__r = (duration)0;
      cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&endTime);
      cmake::IssueMessage(pcVar2,AUTHOR_WARNING,&local_540,(cmListFileBacktrace *)&endTime);
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&endTime);
      std::__cxx11::string::~string((string *)&local_540);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4e0);
    }
    ms.__r = std::chrono::_V2::steady_clock::now();
    local_570.__r =
         (rep_conflict)
         std::chrono::operator-
                   ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     *)&ms,&local_18);
    local_568.__r =
         (rep_conflict)
         std::chrono::
         duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                   (&local_570);
    std::__cxx11::ostringstream::ostringstream(local_6e8);
    poVar9 = std::operator<<((ostream *)local_6e8,"Generating done (");
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,std::fixed);
    local_6ec = (int)std::setprecision(1);
    poVar9 = std::operator<<(poVar9,(_Setprecision)local_6ec);
    rVar10 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_568);
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,(longdouble)rVar10 / (longdouble)1000.0);
    std::operator<<(poVar9,"s)");
    pcVar2 = this->CMakeInstance;
    std::__cxx11::ostringstream::str();
    cmake::UpdateProgress(pcVar2,&local_710,-1.0);
    std::__cxx11::string::~string((string *)&local_710);
    std::__cxx11::ostringstream::~ostringstream(local_6e8);
  }
  else {
    bVar1 = cmSystemTools::GetErrorOccurredFlag();
    if (!bVar1) {
      pcVar2 = GetCMakeInstance(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"Problem setting up custom targets for QtAutoGen",&local_71);
      _auStack_88 = (element_type *)0x0;
      _Stack_80._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)auStack_88);
      cmake::IssueMessage(pcVar2,FATAL_ERROR,&local_70,(cmListFileBacktrace *)auStack_88);
      cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)auStack_88);
      std::__cxx11::string::~string((string *)&local_70);
      std::allocator<char>::~allocator(&local_71);
    }
  }
  return;
}

Assistant:

void cmGlobalGenerator::Generate()
{
  auto startTime = std::chrono::steady_clock::now();

  // Create a map from local generator to the complete set of targets
  // it builds by default.
  this->InitializeProgressMarks();

  this->ProcessEvaluationFiles();

  this->CMakeInstance->UpdateProgress("Generating", 0.1f);

#ifndef CMAKE_BOOTSTRAP
  if (!this->QtAutoGen->SetupCustomTargets()) {
    if (!cmSystemTools::GetErrorOccurredFlag()) {
      this->GetCMakeInstance()->IssueMessage(
        MessageType::FATAL_ERROR,
        "Problem setting up custom targets for QtAutoGen");
    }
    return;
  }
#endif

  // Generate project files
  for (unsigned int i = 0; i < this->LocalGenerators.size(); ++i) {
    this->SetCurrentMakefile(this->LocalGenerators[i]->GetMakefile());
    this->LocalGenerators[i]->Generate();
    if (!this->LocalGenerators[i]->GetMakefile()->IsOn(
          "CMAKE_SKIP_INSTALL_RULES")) {
      this->LocalGenerators[i]->GenerateInstallRules();
    }
    this->LocalGenerators[i]->GenerateTestFiles();
    this->CMakeInstance->UpdateProgress(
      "Generating",
      0.1f +
        0.9f * (static_cast<float>(i) + 1.0f) /
          static_cast<float>(this->LocalGenerators.size()));
  }
  this->SetCurrentMakefile(nullptr);

  if (!this->GenerateCPackPropertiesFile()) {
    this->GetCMakeInstance()->IssueMessage(
      MessageType::FATAL_ERROR, "Could not write CPack properties file.");
  }

  for (auto& buildExpSet : this->BuildExportSets) {
    if (!buildExpSet.second->GenerateImportFile()) {
      if (!cmSystemTools::GetErrorOccurredFlag()) {
        this->GetCMakeInstance()->IssueMessage(MessageType::FATAL_ERROR,
                                               "Could not write export file.");
      }
      return;
    }
  }
  // Update rule hashes.
  this->CheckRuleHashes();

  this->WriteSummary();

  if (this->ExtraGenerator) {
    this->ExtraGenerator->Generate();
  }

  // Perform validation checks on memoized link structures.
  this->CheckTargetLinkLibraries();

  if (!this->CMP0042WarnTargets.empty()) {
    std::ostringstream w;
    w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0042) << "\n";
    w << "MACOSX_RPATH is not specified for"
         " the following targets:\n";
    for (std::string const& t : this->CMP0042WarnTargets) {
      w << " " << t << "\n";
    }
    this->GetCMakeInstance()->IssueMessage(MessageType::AUTHOR_WARNING,
                                           w.str());
  }

  if (!this->CMP0068WarnTargets.empty()) {
    std::ostringstream w;
    /* clang-format off */
    w <<
      cmPolicies::GetPolicyWarning(cmPolicies::CMP0068) << "\n"
      "For compatibility with older versions of CMake, the install_name "
      "fields for the following targets are still affected by RPATH "
      "settings:\n"
      ;
    /* clang-format on */
    for (std::string const& t : this->CMP0068WarnTargets) {
      w << " " << t << "\n";
    }
    this->GetCMakeInstance()->IssueMessage(MessageType::AUTHOR_WARNING,
                                           w.str());
  }

  auto endTime = std::chrono::steady_clock::now();
  auto ms =
    std::chrono::duration_cast<std::chrono::milliseconds>(endTime - startTime);
  std::ostringstream msg;
  msg << "Generating done (" << std::fixed << std::setprecision(1)
      << ms.count() / 1000.0L << "s)";
  this->CMakeInstance->UpdateProgress(msg.str(), -1);
}